

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<tcu::Texture2DArray>::SharedPtr
          (SharedPtr<tcu::Texture2DArray> *this,Texture2DArray *ptr)

{
  Texture2DArray *pTVar1;
  SharedPtrState<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *pSVar2;
  DefaultDeleter<tcu::Texture2DArray> local_25 [13];
  Texture2DArray *local_18;
  Texture2DArray *ptr_local;
  SharedPtr<tcu::Texture2DArray> *this_local;
  
  this->m_ptr = (Texture2DArray *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Texture2DArray *)this;
  pSVar2 = (SharedPtrState<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
           operator_new(0x20);
  pTVar1 = local_18;
  DefaultDeleter<tcu::Texture2DArray>::DefaultDeleter(local_25);
  SharedPtrState<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::SharedPtrState
            (pSVar2,pTVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}